

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

bool __thiscall fasttext::Autotune::quantize(Autotune *this,Args *args,Args *autotuneArgs)

{
  int iVar1;
  int64_t iVar2;
  int64_t fileSize;
  size_t sVar3;
  ostream *poVar4;
  bool bVar5;
  element_type *local_40;
  
  iVar2 = Args::getAutotuneModelSize(autotuneArgs);
  bVar5 = true;
  if (iVar2 != -1) {
    FastText::getOutputMatrix((FastText *)&stack0xffffffffffffffc0);
    iVar2 = Matrix::size((Matrix *)local_40,0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    args->qout = 0xff < iVar2;
    args->retrain = true;
    args->qnorm = true;
    sVar3 = args->dsub;
    fileSize = Args::getAutotuneModelSize(autotuneArgs);
    iVar1 = getCutoffForFileSize(this,0xff < iVar2,true,(int)sVar3,fileSize);
    sVar3 = (size_t)iVar1;
    args->cutoff = sVar3;
    if (2 < autotuneArgs->verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,"cutoff = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      sVar3 = args->cutoff;
    }
    if (sVar3 == 0x100) {
      bVar5 = false;
    }
    else {
      FastText::quantize((this->fastText_).
                         super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         args);
    }
  }
  return bVar5;
}

Assistant:

bool Autotune::quantize(Args& args, const Args& autotuneArgs) {
  if (autotuneArgs.getAutotuneModelSize() == Args::kUnlimitedModelSize) {
    return true;
  }
  auto outputSize = fastText_->getOutputMatrix()->size(0);

  args.qnorm = true;
  args.qout = (outputSize >= kCutoffLimit);
  args.retrain = true;
  args.cutoff = getCutoffForFileSize(
      args.qout, args.qnorm, args.dsub, autotuneArgs.getAutotuneModelSize());
  LOG_VAL(cutoff, args.cutoff);
  if (args.cutoff == kCutoffLimit) {
    return false;
  }
  fastText_->quantize(args);

  return true;
}